

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

int lyp_check_import(lys_module *module,char *value,lys_import *imp)

{
  uint8_t uVar1;
  char cVar2;
  int iVar3;
  lys_module *plVar4;
  LY_ERR *pLVar5;
  char *revision;
  long lVar6;
  int iVar7;
  lys_module *plVar8;
  
  if ((ulong)module->imp_size != 0) {
    lVar6 = 0;
    do {
      plVar8 = *(lys_module **)(module->imp->rev + lVar6 + -0x10);
      if ((plVar8 != (lys_module *)0x0) && (plVar8->name == value)) {
        cVar2 = imp->rev[0];
        if (cVar2 == '\0') goto LAB_001273c0;
        if ((plVar8->rev_size == '\0') || (iVar3 = strcmp(plVar8->rev->date,imp->rev), iVar3 != 0))
        goto LAB_00127479;
        if (cVar2 != '\0') {
          imp->module = plVar8;
          return 0;
        }
        goto LAB_001273c0;
      }
      lVar6 = lVar6 + 0x38;
    } while ((ulong)module->imp_size * 0x38 - lVar6 != 0);
  }
  plVar8 = (lys_module *)0x0;
LAB_001273c0:
  iVar3 = lyp_check_circmod(module,value,1);
  iVar7 = -1;
  if (iVar3 == 0) {
    iVar7 = 0;
    revision = imp->rev;
    if (imp->rev[0] == '\0') {
      revision = (char *)0x0;
    }
    plVar4 = ly_ctx_load_sub_module
                       (module->ctx,(lys_module *)0x0,value,revision,(module->ctx->models).flags & 1
                        ,(unres_schema *)0x0);
    imp->module = plVar4;
    if (plVar4 == (lys_module *)0x0) {
      pLVar5 = ly_errno_location();
      *pLVar5 = LY_EVALID;
      ly_log(LY_LLERR,"Importing \"%s\" module into \"%s\" failed.",value,module->name);
      iVar7 = -1;
    }
    else if (plVar8 != (lys_module *)0x0) {
      if (plVar8 == plVar4) {
        uVar1 = plVar8->rev_size;
        if ((uVar1 == plVar4->rev_size) || ((uVar1 != '\0' && (plVar4->rev_size == '\0')))) {
          if (uVar1 == '\0') {
            return 0;
          }
          iVar3 = strcmp(plVar8->rev->date,plVar4->rev->date);
          if (iVar3 == 0) {
            return 0;
          }
        }
      }
LAB_00127479:
      ly_vlog(LYE_INARG,LY_VLOG_NONE,(void *)0x0,value,"import");
      iVar7 = -1;
      ly_vlog(LYE_SPEC,LY_VLOG_NONE,(void *)0x0,"Importing multiple revisions of module \"%s\".",
              value);
    }
  }
  return iVar7;
}

Assistant:

int
lyp_check_import(struct lys_module *module, const char *value, struct lys_import *imp)
{
    int i;
    struct lys_module *dup = NULL;

    /* check for importing a single module in multiple revisions */
    for (i = 0; i < module->imp_size; i++) {
        if (!module->imp[i].module) {
            /* skip the not yet filled records */
            continue;
        }
        if (ly_strequal(module->imp[i].module->name, value, 1)) {
            /* check revisions, including multiple revisions of a single module is error */
            if (imp->rev[0] && (!module->imp[i].module->rev_size || strcmp(module->imp[i].module->rev[0].date, imp->rev))) {
                /* the already imported module has
                 * - no revision, but here we require some
                 * - different revision than the one required here */
                LOGVAL(LYE_INARG, LY_VLOG_NONE, NULL, value, "import");
                LOGVAL(LYE_SPEC, LY_VLOG_NONE, NULL, "Importing multiple revisions of module \"%s\".", value);
                return -1;
            } else if (!imp->rev[0]) {
                /* no revision, remember the duplication, but check revisions after loading the module
                 * because the current revision can be the same (then it is ok) or it can differ (then it
                 * is error */
                dup = module->imp[i].module;
                break;
            }

            /* there is duplication, but since prefixes differs (checked in caller of this function),
             * it is ok */
            imp->module = module->imp[i].module;
            return 0;
        }
    }

    /* circular import check */
    if (lyp_check_circmod(module, value, 1)) {
        return -1;
    }

    /* load module - in specific situations it tries to get the module from the context */
    imp->module = (struct lys_module *)ly_ctx_load_sub_module(module->ctx, NULL, value, imp->rev[0] ? imp->rev : NULL,
                                                              module->ctx->models.flags & LY_CTX_ALLIMPLEMENTED ? 1 : 0,
                                                              NULL);

    /* check the result */
    if (!imp->module) {
        LOGERR(LY_EVALID, "Importing \"%s\" module into \"%s\" failed.", value, module->name);
        return -1;
    }

    if (dup) {
        /* check the revisions */
        if ((dup != imp->module) ||
                (dup->rev_size != imp->module->rev_size && (!dup->rev_size || imp->module->rev_size)) ||
                (dup->rev_size && strcmp(dup->rev[0].date, imp->module->rev[0].date))) {
            /* - modules are not the same
             * - one of modules has no revision (except they both has no revision)
             * - revisions of the modules are not the same */
            LOGVAL(LYE_INARG, LY_VLOG_NONE, NULL, value, "import");
            LOGVAL(LYE_SPEC, LY_VLOG_NONE, NULL, "Importing multiple revisions of module \"%s\".", value);
            return -1;
        }
    }

    return 0;
}